

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::skip_escape(CTcTokenizer *this,utf8_ptr *p)

{
  wchar_t wVar1;
  utf8_ptr *in_RDI;
  utf8_ptr *unaff_retaddr;
  utf8_ptr *in_stack_00000008;
  utf8_ptr dst;
  char buf [10];
  char *in_stack_ffffffffffffffc8;
  utf8_ptr *puVar2;
  
  puVar2 = in_RDI;
  wVar1 = utf8_ptr::getch((utf8_ptr *)0x2e7932);
  if (wVar1 == L'\\') {
    utf8_ptr::utf8_ptr(in_RDI,in_stack_ffffffffffffffc8);
    xlat_escape((CTcTokenizer *)dst.p_,in_stack_00000008,unaff_retaddr,
                (wchar_t)((ulong)puVar2 >> 0x20),(int)puVar2);
  }
  else {
    utf8_ptr::inc(in_RDI);
  }
  return;
}

Assistant:

void CTcTokenizer::skip_escape(utf8_ptr *p)
{
    if (p->getch() == '\\')
    {
        /* translate an escape into an empty buffer */
        char buf[10];
        utf8_ptr dst(buf);
        xlat_escape(&dst, p, 0, FALSE);
    }
    else
    {
        /* just skip the character */
        p->inc();
    }
}